

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_matrix_stride
          (Compiler *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  CompilerError *pCVar2;
  allocator local_91;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  Decoration *local_38;
  Decoration *dec;
  Meta *local_28;
  Meta *type_meta;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  dec._4_4_ = (type->super_IVariant).self.id;
  type_meta._4_4_ = index;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  local_28 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  if (local_28 == (Meta *)0x0) {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_90,"Struct member does not have MatrixStride set.",&local_91);
    CompilerError::CompilerError(pCVar2,(string *)local_90);
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_38 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(local_28->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)type_meta._4_4_);
  bVar1 = Bitset::get(&local_38->decoration_flags,7);
  if (!bVar1) {
    local_6d = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_58,"Struct member does not have MatrixStride set.",&local_59);
    CompilerError::CompilerError(pCVar2,(string *)local_58);
    local_6d = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return local_38->matrix_stride;
}

Assistant:

uint32_t Compiler::type_struct_member_matrix_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.self);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// MatrixStride is part of OpMemberDecorate.
		auto &dec = type_meta->members[index];
		if (dec.decoration_flags.get(DecorationMatrixStride))
			return dec.matrix_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have MatrixStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have MatrixStride set.");
}